

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O1

void __thiscall EncoderVelocity::Init(EncoderVelocity *this)

{
  this->clkPeriod = 1.0;
  this->velPeriod = 0;
  this->velOverflow = false;
  this->velPeriodMax = 0;
  *(undefined4 *)((long)&this->velPeriodMax + 3) = 0;
  this->partialCycle = true;
  this->qtr1Period = 0;
  *(undefined4 *)((long)&this->qtr1Period + 3) = 0;
  this->qtr5Period = 0;
  *(undefined4 *)((long)&this->qtr5Period + 3) = 0;
  this->runOverflow = false;
  this->qtrPeriodMax = 0;
  this->runPeriod = 0;
  return;
}

Assistant:

void EncoderVelocity::Init()
{
    clkPeriod = 1.0;
    velPeriod = 0;
    velOverflow = false;
    velPeriodMax = 0;
    velDir = false;
    dirChange = false;
    encError = false;
    partialCycle = true;
    qtr1Period = 0;
    qtr1Overflow = false;
    qtr1Dir = false;
    qtr1Edges = 0;
    qtr5Period = 0;
    qtr5Overflow = false;
    qtr5Dir = false;
    qtr5Edges = 0;
    qtrPeriodMax = 0;
    runPeriod = 0;
    runOverflow = false;
}